

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O0

JavascriptString *
Js::JavascriptObject::ToStringTagHelper(Var thisArg,ScriptContext *scriptContext,TypeId type)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  int iVar4;
  JavascriptLibrary *this;
  RecyclableObject *thisArg_00;
  undefined4 extraout_var;
  undefined4 *puVar5;
  CompoundString *local_58;
  JavascriptString *builtInTag;
  anon_class_8_1_1b6df084 aStack_48;
  BOOL isArray;
  anon_class_8_1_1b6df084 buildToString;
  Var tag;
  RecyclableObject *thisArgAsObject;
  JavascriptLibrary *library;
  ScriptContext *pSStack_20;
  TypeId type_local;
  ScriptContext *scriptContext_local;
  Var thisArg_local;
  
  pSStack_20 = scriptContext;
  scriptContext_local = (ScriptContext *)thisArg;
  this = ScriptContext::GetLibrary(scriptContext);
  if (type == TypeIds_Undefined) {
    thisArg_local = JavascriptLibrary::GetObjectUndefinedDisplayString(this);
  }
  else if (type == TypeIds_Null) {
    thisArg_local = JavascriptLibrary::GetObjectNullDisplayString(this);
  }
  else {
    thisArg_00 = Js::JavascriptOperators::ToObject(scriptContext_local,pSStack_20);
    buildToString.scriptContext = (ScriptContext **)GetToStringTagValue(thisArg_00,pSStack_20);
    aStack_48.scriptContext = &stack0xffffffffffffffe0;
    if ((buildToString.scriptContext == (ScriptContext **)0x0) ||
       (bVar2 = VarIs<Js::JavascriptString>(buildToString.scriptContext), !bVar2)) {
      bVar2 = Js::JavascriptOperators::IsArray(thisArg_00);
      if (bVar2) {
        thisArg_local = JavascriptLibrary::GetObjectArrayDisplayString(this);
      }
      else {
        library._4_4_ = type;
        if ((type == TypeIds_Proxy) && (bVar2 = JavascriptConversion::IsCallable(thisArg_00), bVar2)
           ) {
          library._4_4_ = TypeIds_Function;
        }
        switch(library._4_4_) {
        case TypeIds_Boolean:
        case TypeIds_BooleanObject:
          local_58 = (CompoundString *)JavascriptLibrary::GetObjectBooleanDisplayString(this);
          break;
        case TypeIds_FirstNumberType:
        case TypeIds_Number:
        case TypeIds_Int64Number:
        case TypeIds_LastNumberType:
        case TypeIds_NumberObject:
          local_58 = (CompoundString *)JavascriptLibrary::GetObjectNumberDisplayString(this);
          break;
        case TypeIds_String:
        case TypeIds_StringObject:
          local_58 = (CompoundString *)JavascriptLibrary::GetObjectStringDisplayString(this);
          break;
        default:
          BVar3 = RecyclableObject::IsExternal(thisArg_00);
          if (BVar3 == 0) {
            local_58 = (CompoundString *)JavascriptLibrary::GetObjectDisplayString(this);
          }
          else {
            iVar4 = (*(thisArg_00->super_FinalizableObject).super_IRecyclerVisitedObject.
                      _vptr_IRecyclerVisitedObject[0x46])(thisArg_00,pSStack_20);
            local_58 = ToStringTagHelper::anon_class_8_1_1b6df084::operator()
                                 (&stack0xffffffffffffffb8,(Var)CONCAT44(extraout_var,iVar4));
          }
          break;
        case TypeIds_Function:
          local_58 = (CompoundString *)JavascriptLibrary::GetObjectFunctionDisplayString(this);
          break;
        case TypeIds_Date:
          local_58 = (CompoundString *)JavascriptLibrary::GetObjectDateDisplayString(this);
          break;
        case TypeIds_RegEx:
          local_58 = (CompoundString *)JavascriptLibrary::GetObjectRegExpDisplayString(this);
          break;
        case TypeIds_Error:
          local_58 = (CompoundString *)JavascriptLibrary::GetObjectErrorDisplayString(this);
          break;
        case TypeIds_Arguments:
          local_58 = (CompoundString *)JavascriptLibrary::GetObjectArgumentsDisplayString(this);
        }
        if (local_58 == (CompoundString *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                      ,0x246,"(builtInTag != nullptr)","builtInTag != nullptr");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        thisArg_local = local_58;
      }
    }
    else {
      thisArg_local =
           ToStringTagHelper::anon_class_8_1_1b6df084::operator()
                     (&stack0xffffffffffffffb8,buildToString.scriptContext);
    }
  }
  return (JavascriptString *)thisArg_local;
}

Assistant:

JavascriptString* JavascriptObject::ToStringTagHelper(Var thisArg, ScriptContext *scriptContext, TypeId type)
{
    JavascriptLibrary *library = scriptContext->GetLibrary();

    // 1. If the this value is undefined, return "[object Undefined]".
    if (type == TypeIds_Undefined)
    {
        return library->GetObjectUndefinedDisplayString();
    }
    // 2. If the this value is null, return "[object Null]".
    if (type == TypeIds_Null)
    {
        return library->GetObjectNullDisplayString();
    }

    // 3. Let O be ToObject(this value).
    RecyclableObject *thisArgAsObject = JavascriptOperators::ToObject(thisArg, scriptContext);

    // 15. Let tag be ? Get(O, @@toStringTag).
    Var tag = JavascriptObject::GetToStringTagValue(thisArgAsObject, scriptContext);

    // 17. Return the String that is the result of concatenating "[object ", tag, and "]".
    auto buildToString = [&scriptContext](Var tag) {
        JavascriptString *tagStr = VarTo<JavascriptString>(tag);
        const WCHAR objectStartString[9] = _u("[object ");
        const WCHAR objectEndString[1] = { _u(']') };
        CompoundString *const cs = CompoundString::NewWithCharCapacity(_countof(objectStartString)
            + _countof(objectEndString) + tagStr->GetLength(), scriptContext->GetLibrary());

        cs->AppendChars(objectStartString, _countof(objectStartString) - 1 /* ditch \0 */);
        cs->AppendChars(tagStr);
        cs->AppendChars(objectEndString, _countof(objectEndString));

        return cs;
    };
    if (tag != nullptr && VarIs<JavascriptString>(tag))
    {
        return buildToString(tag);
    }

    // 4. Let isArray be ? IsArray(O).
    // There is an implicit check for a null proxy handler in IsArray, so use the operator.
    BOOL isArray = JavascriptOperators::IsArray(thisArgAsObject);

    // If we don't have a tag or it's not a string, use the 'built in tag'.
    if (isArray)
    {
        // 5. If isArray is true, let builtinTag be "Array".
        return library->GetObjectArrayDisplayString();
    }

        // callable proxy is considered as having [[Call]] internal method and should match #8 below
        if (type == TypeIds_Proxy && JavascriptConversion::IsCallable(thisArgAsObject))
        {
            type = TypeIds_Function;
        }

    JavascriptString* builtInTag = nullptr;
    switch (type)
    {
        // 6. Else if O is an exotic String object, let builtinTag be "String".
    case TypeIds_String:
    case TypeIds_StringObject:
        builtInTag = library->GetObjectStringDisplayString();
        break;

        // 7. Else if O has an[[ParameterMap]] internal slot, let builtinTag be "Arguments".
    case TypeIds_Arguments:
        builtInTag = library->GetObjectArgumentsDisplayString();
        break;

        // 8. Else if O has a [[Call]] internal method, let builtinTag be "Function".
    case TypeIds_Function:
        builtInTag = library->GetObjectFunctionDisplayString();
        break;

        // 9. Else if O has an [[ErrorData]] internal slot, let builtinTag be "Error".
    case TypeIds_Error:
        builtInTag = library->GetObjectErrorDisplayString();
        break;

        // 10. Else if O has a [[BooleanData]] internal slot, let builtinTag be "Boolean".
    case TypeIds_Boolean:
    case TypeIds_BooleanObject:
        builtInTag = library->GetObjectBooleanDisplayString();
        break;

        // 11. Else if O has a [[NumberData]] internal slot, let builtinTag be "Number".
    case TypeIds_Number:
    case TypeIds_Int64Number:
    case TypeIds_UInt64Number:
    case TypeIds_Integer:
    case TypeIds_NumberObject:
        builtInTag = library->GetObjectNumberDisplayString();
        break;

        // 12. Else if O has a [[DateValue]] internal slot, let builtinTag be "Date".
    case TypeIds_Date:
        builtInTag = library->GetObjectDateDisplayString();
        break;

        // 13. Else if O has a [[RegExpMatcher]] internal slot, let builtinTag be "RegExp".
    case TypeIds_RegEx:
        builtInTag = library->GetObjectRegExpDisplayString();
        break;

        // 14. Else, let builtinTag be "Object".
    default:
    {
        if (thisArgAsObject->IsExternal())
        {
            builtInTag = buildToString(thisArgAsObject->GetClassName(scriptContext));
        }
        else
        {
            builtInTag = library->GetObjectDisplayString(); // [object Object]
        }
        break;
    }
    }

    Assert(builtInTag != nullptr);

    return builtInTag;
}